

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

shared_ptr<Guild> __thiscall
GuildManager::CreateGuild(GuildManager *this,shared_ptr<Guild_Create> *create,string *description)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  World *this_00;
  Character *recruiter;
  string *psVar7;
  int width;
  mapped_type *pmVar8;
  time_t tVar9;
  Character *joined;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  shared_ptr<Guild> sVar13;
  allocator local_e9;
  string *local_e8;
  element_type *local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d8;
  shared_ptr<Guild_Member> member;
  key_type local_b0;
  string local_90 [32];
  string local_70;
  Database_Result local_50;
  
  p_Var1 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_e8 = description;
  local_e0 = (element_type *)this;
  std::__cxx11::string::string((string *)&local_b0,"GuildMaxWidth",&local_e9);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&p_Var1[0x19]._M_use_count,&local_b0);
  width = util::variant::GetInt(pmVar8);
  util::text_word_wrap((string *)&member,in_RCX,width);
  std::__cxx11::string::operator=((string *)in_RCX,(string *)&member);
  std::__cxx11::string::~string((string *)&member);
  std::__cxx11::string::~string((string *)&local_b0);
  p_Var1 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pcVar2 = (local_e8->_M_dataplus)._M_p;
  uVar3 = *(undefined8 *)(pcVar2 + 0x28);
  uVar4 = *(undefined8 *)(pcVar2 + 0x48);
  local_d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(in_RCX->_M_dataplus)._M_p;
  tVar9 = time((time_t *)0x0);
  p_Var5 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::__cxx11::string::string((string *)&local_b0,"GuildDefaultRanks",&local_e9);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&p_Var5[0x19]._M_use_count,&local_b0);
  util::variant::GetString_abi_cxx11_((string *)&member,pmVar8);
  Database::Query(&local_50,(Database *)&p_Var1[8]._M_use_count,
                  "INSERT INTO `guilds` (`tag`, `name`, `description`, `created`, `ranks`) VALUES (\'$\', \'$\', \'$\', #, \'$\')"
                  ,uVar3,uVar4,local_d8,tVar9,
                  member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ::~vector(&local_50.
             super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           );
  std::__cxx11::string::~string((string *)&member);
  std::__cxx11::string::~string((string *)&local_b0);
  psVar7 = local_e8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(create + 4),(local_e8->_M_dataplus)._M_p + 0x28);
  std::__cxx11::string::string(local_90,(string *)((psVar7->_M_dataplus)._M_p + 0x28));
  peVar12 = local_e0;
  GetGuild((GuildManager *)local_e0,(string *)create);
  std::__cxx11::string::~string(local_90);
  _Var10._M_pi = extraout_RDX;
  if ((peVar12->super_enable_shared_from_this<Guild>)._M_weak_this.
      super___weak_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    pcVar2 = (local_e8->_M_dataplus)._M_p;
    p_Var6 = *(__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x70);
    local_d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(create + 4);
    for (p_Var11 = *(__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x68);
        peVar12 = local_e0, p_Var11 != p_Var6; p_Var11 = p_Var11 + 1) {
      std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>,p_Var11);
      this_00 = (World *)create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
      std::__cxx11::string::string
                ((string *)&local_70,
                 (string *)
                 member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      joined = World::GetCharacterReal(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (joined != (Character *)0x0) {
        recruiter = *(Character **)((local_e8->_M_dataplus)._M_p + 0x20);
        Guild::AddMember((local_e0->super_enable_shared_from_this<Guild>)._M_weak_this.
                         super___weak_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr,joined,recruiter
                         ,false,(uint)(joined != recruiter) * 9);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(local_d8,(local_e8->_M_dataplus)._M_p + 0x28);
    _Var10._M_pi = extraout_RDX_00;
  }
  sVar13.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi;
  sVar13.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
  return (shared_ptr<Guild>)sVar13.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Guild> GuildManager::CreateGuild(std::shared_ptr<Guild_Create> create, std::string description)
{
	description = util::text_word_wrap(description, this->world->config["GuildMaxWidth"]);

	this->world->db.Query("INSERT INTO `guilds` (`tag`, `name`, `description`, `created`, `ranks`) VALUES ('$', '$', '$', #, '$')", create->tag.c_str(), create->name.c_str(), description.c_str(), int(std::time(0)), static_cast<std::string>(this->world->config["GuildDefaultRanks"]).c_str());

	this->create_cache.erase(create->tag);

	std::shared_ptr<Guild> guild = this->GetGuild(create->tag);

	if (guild)
	{
		UTIL_FOREACH(create->members, member)
		{
			Character *character = this->world->GetCharacterReal(member->name);

			if (character)
			{
				guild->AddMember(character, create->leader, false, (character == create->leader) ? 0 : 9);
			}
		}

		this->create_cache.erase(create->tag);
	}

	return guild;
}